

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O2

int ffcdel(fitsfile *fptr,LONGLONG naxis1,LONGLONG naxis2,LONGLONG ndelete,LONGLONG bytepos,
          int *status)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long nchars;
  ulong uVar5;
  long firstchar;
  long firstchar_00;
  bool bVar6;
  long local_2778;
  long local_2770;
  uchar buffer [10000];
  
  iVar1 = *status;
  if (naxis2 != 0 && iVar1 < 1) {
    nchars = naxis1 - ndelete;
    if (nchars < 0x2711) {
      lVar2 = bytepos + ndelete + 1;
      for (lVar4 = 1; lVar4 < naxis2; lVar4 = lVar4 + 1) {
        ffgtbb(fptr,lVar4,lVar2,nchars,buffer,status);
        fptr->Fptr->rowlength = nchars;
        ffptbb(fptr,lVar4,bytepos + 1,nchars,buffer,status);
        fptr->Fptr->rowlength = naxis1;
      }
      lVar4 = naxis1 - (ndelete + bytepos);
      if (0 < lVar4) {
        ffgtbb(fptr,naxis2,lVar2,lVar4,buffer,status);
        fptr->Fptr->rowlength = nchars;
        ffptbb(fptr,naxis2,bytepos + 1,lVar4,buffer,status);
        fptr->Fptr->rowlength = naxis1;
      }
    }
    else {
      uVar3 = (nchars + 9999U) / 10000;
      local_2770 = bytepos + 1;
      local_2778 = bytepos + ndelete + 1;
      for (lVar4 = 1; lVar2 = nchars + 10000 + uVar3 * -10000, uVar5 = uVar3, firstchar = local_2778
          , firstchar_00 = local_2770, lVar4 < naxis2; lVar4 = lVar4 + 1) {
        while (uVar5 != 0) {
          ffgtbb(fptr,lVar4,firstchar,lVar2,buffer,status);
          fptr->Fptr->rowlength = nchars;
          ffptbb(fptr,lVar4,firstchar_00,lVar2,buffer,status);
          fptr->Fptr->rowlength = naxis1;
          firstchar_00 = firstchar_00 + lVar2;
          firstchar = firstchar + lVar2;
          lVar2 = 10000;
          uVar5 = uVar5 - 1;
        }
      }
      lVar4 = naxis1 - (ndelete + bytepos);
      if (0 < lVar4) {
        uVar3 = (lVar4 + 9999U) / 10000;
        lVar4 = lVar4 + 10000 + uVar3 * -10000;
        while (bVar6 = uVar3 != 0, uVar3 = uVar3 - 1, bVar6) {
          ffgtbb(fptr,naxis2,local_2778,lVar4,buffer,status);
          fptr->Fptr->rowlength = nchars;
          ffptbb(fptr,naxis2,local_2770,lVar4,buffer,status);
          fptr->Fptr->rowlength = naxis1;
          local_2770 = local_2770 + lVar4;
          local_2778 = local_2778 + lVar4;
          lVar4 = 10000;
        }
      }
    }
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int ffcdel(fitsfile *fptr,  /* I - FITS file pointer                        */
           LONGLONG naxis1,     /* I - width of the table, in bytes             */
           LONGLONG naxis2,     /* I - number of rows in the table              */
           LONGLONG ndelete,    /* I - number of bytes to delete in each row    */
           LONGLONG bytepos,    /* I - rel. position in row to delete bytes     */
           int *status)     /* IO - error status                            */
/*
 delete 'ndelete' bytes from each row of the table at position 'bytepos'.  */
{
    unsigned char buffer[10000];
    LONGLONG i1, i2, ii, irow, nseg;
    LONGLONG newlen, remain, nbytes;

    if (*status > 0)
        return(*status);

    if (naxis2 == 0)
        return(*status);  /* just return if there are 0 rows in the table */

    newlen = naxis1 - ndelete;

    if (newlen <= 10000)
    {
      /*******************************************************************
      CASE #1: optimal case where whole new row fits in the work buffer
      *******************************************************************/
      i1 = bytepos + 1;
      i2 = i1 + ndelete;
      for (irow = 1; irow < naxis2; irow++)
      {
        ffgtbb(fptr, irow, i2, newlen, buffer, status); /* read row */
        (fptr->Fptr)->rowlength = newlen;  /* new row length */

        ffptbb(fptr, irow, i1, newlen, buffer, status); /* write row */
        (fptr->Fptr)->rowlength = naxis1;  /* reset to orig value */
      }

      /* now do the last row */
      remain = naxis1 - (bytepos + ndelete);

      if (remain > 0)
      {
        ffgtbb(fptr, naxis2, i2, remain, buffer, status); /* read row */
        (fptr->Fptr)->rowlength = newlen;  /* new row length */

        ffptbb(fptr, naxis2, i1, remain, buffer, status); /* write row */
        (fptr->Fptr)->rowlength = naxis1;  /* reset to orig value */
      }
    }
    else
    {
        /*****************************************************************
        CASE #2:  whole row doesn't fit in work buffer; move row in pieces
        ******************************************************************/

        nseg = (newlen + 9999) / 10000;
        for (irow = 1; irow < naxis2; irow++)
        {
          i1 = bytepos + 1;
          i2 = i1 + ndelete;

          nbytes = newlen - (nseg - 1) * 10000;
          for (ii = 0; ii < nseg; ii++)
          { 
            ffgtbb(fptr, irow, i2, nbytes, buffer, status); /* read bytes */
            (fptr->Fptr)->rowlength = newlen;  /* new row length */

            ffptbb(fptr, irow, i1, nbytes, buffer, status); /* rewrite bytes */
            (fptr->Fptr)->rowlength = naxis1; /* reset to orig value */

            i1 += nbytes;
            i2 += nbytes;
            nbytes = 10000;
          }
        }

        /* now do the last row */
        remain = naxis1 - (bytepos + ndelete);

        if (remain > 0)
        {
          nseg = (remain + 9999) / 10000;
          i1 = bytepos + 1;
          i2 = i1 + ndelete;
          nbytes = remain - (nseg - 1) * 10000;
          for (ii = 0; ii < nseg; ii++)
          { 
            ffgtbb(fptr, naxis2, i2, nbytes, buffer, status);
            (fptr->Fptr)->rowlength = newlen;  /* new row length */

            ffptbb(fptr, naxis2, i1, nbytes, buffer, status); /* write row */
            (fptr->Fptr)->rowlength = naxis1;  /* reset to orig value */

            i1 += nbytes;
            i2 += nbytes;
            nbytes = 10000;
          }
        }
    }
    return(*status);
}